

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O0

wchar_t borg_attack_aux_rod_bolt(wchar_t sval,wchar_t rad,wchar_t dam,wchar_t typ)

{
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  wchar_t b_n;
  wchar_t typ_local;
  wchar_t dam_local;
  wchar_t rad_local;
  wchar_t sval_local;
  
  if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)) {
    if ((borg_simulate) && (uVar2 = Rand_div(100), (int)uVar2 < 2)) {
      rad_local = L'\0';
    }
    else {
      iVar3 = borg_activate_failure(0x18,sval);
      if (iVar3 < 0x1f5) {
        _Var1 = borg_equips_rod(sval);
        if (_Var1) {
          rad_local = borg_launch_bolt(rad,dam,typ,(uint)z_info->max_range,L'\0');
          if ((borg_simulate & 1U) == 0) {
            borg_zap_rod(sval);
            borg_keypress(0x35);
            successful_target = L'\xffffffff';
          }
        }
        else {
          rad_local = L'\0';
        }
      }
      else {
        rad_local = L'\0';
      }
    }
  }
  else {
    rad_local = L'\0';
  }
  return rad_local;
}

Assistant:

static int borg_attack_aux_rod_bolt(int sval, int rad, int dam, int typ)
{
    int b_n;

    /* No firing while blind, confused, or hallucinating */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE])
        return 0;

    /* Paranoia */
    if (borg_simulate && (randint0(100) < 2))
        return 0;

    /* Not likely to be successful in the activation */
    if (500 < borg_activate_failure(TV_ROD, sval))
        return 0;

    /* Look for that rod */
    if (!borg_equips_rod(sval))
        return 0;

    /* Choose optimal location */
    b_n = borg_launch_bolt(rad, dam, typ, z_info->max_range, 0);

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Zap the rod */
    (void)borg_zap_rod(sval);

    /* Use target */
    borg_keypress('5');

    /* Set our shooting flag */
    successful_target = -1;

    /* Value */
    return b_n;
}